

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzysmp.cpp
# Opt level: O0

void __thiscall
TPZFYsmpMatrix<std::complex<double>_>::CheckTypeCompatibility
          (TPZFYsmpMatrix<std::complex<double>_> *this,TPZMatrix<std::complex<double>_> *A,
          TPZMatrix<std::complex<double>_> *B)

{
  long lVar1;
  bool bVar2;
  int64_t iVar3;
  long *plVar4;
  long in_RDX;
  long in_RSI;
  bool bVar5;
  int i_1;
  int64_t nJA;
  int i;
  int64_t nIA;
  bool check;
  TPZFYsmpMatrix<std::complex<double>_> *bPtr;
  TPZFYsmpMatrix<std::complex<double>_> *aPtr;
  anon_class_1_0_00000001 incompatSparse;
  long local_78;
  long local_68;
  int local_54;
  int local_44;
  
  if (in_RSI == 0) {
    local_68 = 0;
  }
  else {
    local_68 = __dynamic_cast(in_RSI,&TPZMatrix<std::complex<double>>::typeinfo,
                              &TPZFYsmpMatrix<std::complex<double>>::typeinfo,0);
  }
  if (in_RDX == 0) {
    local_78 = 0;
  }
  else {
    local_78 = __dynamic_cast(in_RDX,&TPZMatrix<std::complex<double>>::typeinfo,
                              &TPZFYsmpMatrix<std::complex<double>>::typeinfo,0);
  }
  if ((local_68 == 0) || (local_78 == 0)) {
    CheckTypeCompatibility::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)0x1490a8b);
  }
  bVar5 = false;
  iVar3 = TPZVec<long>::size((TPZVec<long> *)(local_68 + 0x20));
  for (local_44 = 0; local_44 < iVar3; local_44 = local_44 + 1) {
    bVar2 = !bVar5;
    bVar5 = true;
    if (bVar2) {
      plVar4 = TPZVec<long>::operator[]((TPZVec<long> *)(local_68 + 0x20),(long)local_44);
      lVar1 = *plVar4;
      plVar4 = TPZVec<long>::operator[]((TPZVec<long> *)(local_78 + 0x20),(long)local_44);
      bVar5 = lVar1 != *plVar4;
    }
  }
  iVar3 = TPZVec<long>::size((TPZVec<long> *)(local_68 + 0x40));
  for (local_54 = 0; local_54 < iVar3; local_54 = local_54 + 1) {
    bVar2 = !bVar5;
    bVar5 = true;
    if (bVar2) {
      plVar4 = TPZVec<long>::operator[]((TPZVec<long> *)(local_68 + 0x40),(long)local_54);
      lVar1 = *plVar4;
      plVar4 = TPZVec<long>::operator[]((TPZVec<long> *)(local_78 + 0x40),(long)local_54);
      bVar5 = lVar1 != *plVar4;
    }
  }
  if (bVar5) {
    CheckTypeCompatibility::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)0x1490bb5);
  }
  return;
}

Assistant:

void TPZFYsmpMatrix<TVar>::CheckTypeCompatibility(const TPZMatrix<TVar>*A,
																									const TPZMatrix<TVar>*B)const
{
  auto incompatSparse = [](){
    PZError<<__PRETTY_FUNCTION__;
    PZError<<"\nERROR: incompatible matrices\n.Aborting...\n";
    DebugStop();
  };
	auto aPtr = dynamic_cast<const TPZFYsmpMatrix<TVar>*>(A);
  auto bPtr = dynamic_cast<const TPZFYsmpMatrix<TVar>*>(B);
  if(!aPtr || !bPtr){
    incompatSparse();
  }
	bool check{false};
	const auto nIA = aPtr->fIA.size();
	for(auto i = 0; i < nIA; i++){
		check = check || aPtr->fIA[i] != bPtr->fIA[i];
	}

	const auto nJA = aPtr->fJA.size();
	for(auto i = 0; i < nJA; i++){
		check = check || aPtr->fJA[i] != bPtr->fJA[i];
	}
	if(check) incompatSparse();
}